

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_functionApply
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionOperand,
               size_t argumentCount,int16_t *argumentOperands,int applicationFlags)

{
  int32_t iVar1;
  ulong uVar2;
  sysbvm_functionBytecode_t *bytecode;
  ulong *puVar3;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  sysbvm_functionEntryPoint_t calledFunctionPointer;
  void *calledFunctionPointer_00;
  uint uVar7;
  sysbvm_x86_register_t reg;
  uint32_t primitiveNumber;
  undefined6 in_register_00000032;
  sysbvm_function_t *literalFunctionObject;
  size_t sVar8;
  bool bVar9;
  sysbvm_tuple_t literalFunction;
  uint8_t local_43 [4];
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined4 local_3c;
  ulong *local_38;
  
  local_3c = (undefined4)CONCAT62(in_register_00000032,resultOperand);
  local_38 = (ulong *)0x0;
  if (((((applicationFlags & 1U) != 0) &&
       (_Var4 = sysbvm_bytecodeJit_getLiteralValueForOperand
                          (jit,functionOperand,(sysbvm_tuple_t *)&local_38), puVar3 = local_38,
       _Var4)) && (((ulong)local_38 & 0xf) == 0 && local_38 != (ulong *)0x0)) &&
     ((uVar6 = *local_38, (uVar6 & 0xf) == 0 && uVar6 != 0 && ((*(byte *)(uVar6 + 8) & 0x80) == 0)))
     ) {
    uVar6 = *(ulong *)(uVar6 + 0x70);
    bVar9 = (uVar6 & 0xf) == 0;
    uVar5 = (uint)((long)uVar6 >> 4);
    if (uVar6 != 0 && bVar9) {
      if ((*(byte *)(uVar6 + 0x11) & 0x10) == 0) goto LAB_00149ffb;
      uVar7 = (uint)*(undefined8 *)(uVar6 + 0x10);
    }
    else {
      uVar7 = uVar5;
      if (((uint)uVar6 >> 0x10 & 1) == 0) goto LAB_00149ffb;
    }
    if ((uVar7 >> 0xc & 1) != 0) {
      uVar2 = local_38[5];
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar7 = (uint)((long)uVar2 >> 4);
      }
      else {
        uVar7 = (uint)*(undefined8 *)(uVar2 + 0x10);
      }
      if ((uVar7 >> 9 & 1) != 0) goto LAB_00149ffb;
    }
    if (uVar6 != 0 && bVar9) {
      uVar5 = (uint)*(undefined8 *)(uVar6 + 0x10);
    }
    if ((uVar5 >> 0xc & 1) != 0) {
      uVar6 = local_38[5];
      if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
        uVar6 = (long)uVar6 >> 4;
      }
      else {
        uVar6 = *(ulong *)(uVar6 + 0x10);
      }
      if ((uVar6 & 2) != 0) goto LAB_00149ffb;
    }
    uVar6 = local_38[10];
    if (uVar6 != 0) {
      if ((uVar6 & 0xf) == 0) {
        primitiveNumber = *(uint32_t *)(uVar6 + 0x10);
      }
      else {
        primitiveNumber = (uint32_t)(uVar6 >> 4);
      }
      calledFunctionPointer =
           sysbvm_function_getNumberedPrimitiveEntryPoint(jit->context,primitiveNumber);
      if (calledFunctionPointer != (sysbvm_functionEntryPoint_t)0x0) {
        sysbvm_jit_functionApplyDirectWithArgumentsRecord
                  (jit,(int16_t)local_3c,functionOperand,argumentCount,argumentOperands,
                   calledFunctionPointer);
        return;
      }
    }
    if (((puVar3[9] != 0) &&
        (bytecode = *(sysbvm_functionBytecode_t **)(puVar3[9] + 0x80),
        bytecode != (sysbvm_functionBytecode_t *)0x0)) &&
       ((bytecode != (sysbvm_functionBytecode_t *)0x5f &&
        (calledFunctionPointer_00 = sysbvm_jit_getTrampolineOrEntryPointForBytecode(jit,bytecode),
        calledFunctionPointer_00 != (void *)0x0)))) {
      sysbvm_jit_functionApplyDirectVia
                (jit,(int16_t)local_3c,functionOperand,argumentCount,argumentOperands,
                 calledFunctionPointer_00);
      return;
    }
  }
LAB_00149ffb:
  if (argumentCount != 0) {
    sVar8 = 0;
    do {
      sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[sVar8],(int32_t)sVar8);
      sVar8 = sVar8 + 1;
    } while (argumentCount != sVar8);
  }
  iVar1 = jit->contextPointerOffset;
  local_43[0] = 'H';
  local_43[1] = 0x8b;
  local_43[2] = 0xbd;
  local_43[3] = (uint8_t)iVar1;
  local_3f = (undefined1)((uint)iVar1 >> 8);
  local_3e = (undefined1)((uint)iVar1 >> 0x10);
  local_3d = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
  local_43[0] = 'H';
  local_43[1] = 199;
  local_43[2] = 0xc2;
  local_43[3] = (uint8_t)argumentCount;
  local_3f = (undefined1)(argumentCount >> 8);
  local_3e = (undefined1)(argumentCount >> 0x10);
  local_3d = (undefined1)(argumentCount >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  iVar1 = jit->callArgumentVectorOffset;
  local_43[0] = 'H';
  local_43[1] = 0x8d;
  local_43[2] = 0x8d;
  local_43[3] = (uint8_t)iVar1;
  local_3f = (undefined1)((uint)iVar1 >> 8);
  local_3e = (undefined1)((uint)iVar1 >> 0x10);
  local_3d = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  local_43[0] = 'I';
  local_43[1] = 199;
  local_43[2] = 0xc0;
  local_43[3] = (uint8_t)applicationFlags;
  local_3f = (undefined1)((uint)applicationFlags >> 8);
  local_3e = (undefined1)((uint)applicationFlags >> 0x10);
  local_3d = (undefined1)((uint)applicationFlags >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  sysbvm_jit_x86_call(jit,sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
  sysbvm_jit_moveRegisterToOperand(jit,(int16_t)local_3c,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_functionApply(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    bool isNoTypecheck = applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK;

    // Are we calling a literal function?
    sysbvm_tuple_t literalFunction = SYSBVM_NULL_TUPLE;

    if(isNoTypecheck
        && sysbvm_bytecodeJit_getLiteralValueForOperand(jit, functionOperand, &literalFunction)
        && sysbvm_tuple_isFunction(jit->context, literalFunction)
        && !sysbvm_function_isMemoized(jit->context, literalFunction)
        && !sysbvm_function_isVariadic(jit->context, literalFunction))
    {
        // Is this a numbered primitive.
        sysbvm_function_t *literalFunctionObject = (sysbvm_function_t*)literalFunction;
        if(literalFunctionObject->primitiveTableIndex)
        {
            uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(literalFunctionObject->primitiveTableIndex);
            sysbvm_functionEntryPoint_t entryPoint = sysbvm_function_getNumberedPrimitiveEntryPoint(jit->context, primitiveNumber);
            if(entryPoint)
            {
                sysbvm_jit_functionApplyDirectWithArgumentsRecord(jit, resultOperand, functionOperand, argumentCount, argumentOperands, entryPoint);
                return;
            }
        }
        
        if(literalFunctionObject->definition)
        {
            sysbvm_functionDefinition_t *literalFunctionDefinitionObject = (sysbvm_functionDefinition_t*)literalFunctionObject->definition;
            if(literalFunctionDefinitionObject->bytecode && literalFunctionDefinitionObject->bytecode != SYSBVM_PENDING_MEMOIZATION_VALUE)
            {
                void *trampolineOrEntryPoint = sysbvm_jit_getTrampolineOrEntryPointForBytecode(jit, (sysbvm_functionBytecode_t*)literalFunctionDefinitionObject->bytecode);
                if(trampolineOrEntryPoint)
                {
                    //printf("trampolineOrEntryPoint %p\n", trampolineOrEntryPoint);
                    sysbvm_jit_functionApplyDirectVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, trampolineOrEntryPoint);
                    return;
                }
            }
        }
    }

    sysbvm_jit_functionApplyVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, applicationFlags, &sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
}